

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O2

void __thiscall callback_data::save_tensor_for_layer(callback_data *this,ggml_tensor *t)

{
  ggml_context *pgVar1;
  size_t __size;
  ggml_tensor *pgVar2;
  void *pvVar3;
  undefined8 uVar4;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *this_00;
  ggml_tensor *t_layer;
  
  if (t->type == GGML_TYPE_F32) {
    if (this->ctx_ggml == (ggml_context *)0x0) {
      ggml_tensor_overhead();
      pgVar1 = (ggml_context *)ggml_init();
      this->ctx_ggml = pgVar1;
    }
    __size = ggml_nbytes(t);
    pgVar2 = (ggml_tensor *)ggml_new_tensor_2d(this->ctx_ggml,t->type,t->ne[0],t->ne[1]);
    t_layer = pgVar2;
    pvVar3 = malloc(__size);
    pgVar2->data = pvVar3;
    ggml_backend_tensor_get(t,pvVar3,0,__size);
    uVar4 = ggml_get_name(t);
    ggml_set_name(pgVar2,uVar4);
    this_00 = &this->v_neg;
    if (this->is_eval_pos != false) {
      this_00 = &this->v_pos;
    }
    std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::push_back(this_00,&t_layer);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/cvector-generator.cpp"
             ,0x45,"GGML_ASSERT(%s) failed","t->type == GGML_TYPE_F32");
}

Assistant:

void save_tensor_for_layer(struct ggml_tensor * t) {
        GGML_ASSERT(t->type == GGML_TYPE_F32);

        if (ctx_ggml == nullptr) {
            // alloc a new ctx_ggml if needed
            struct ggml_init_params params_ggml = {
                /*.mem_size   =*/ ggml_tensor_overhead() * n_layers * 3u,
                /*.mem_buffer =*/ NULL,
                /*.no_alloc   =*/ true,
            };
            ctx_ggml = ggml_init(params_ggml);
        }

        // copy tensor data
        auto n_bytes = ggml_nbytes(t);
        struct ggml_tensor * t_layer = ggml_new_tensor_2d(ctx_ggml, t->type, t->ne[0], t->ne[1]);
        t_layer->data = malloc(n_bytes); // TODO @ngxson : get rid of this malloc somehow
        ggml_backend_tensor_get(t, t_layer->data, 0, n_bytes);
        ggml_set_name(t_layer, ggml_get_name(t));
        //print_debug_tensor(t_layer);

        if (is_eval_pos) {
            v_pos.push_back(t_layer);
        } else {
            v_neg.push_back(t_layer);
        }
    }